

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cmdline::parser::get<std::__cxx11::string>(parser *this,string *name)

{
  size_type sVar1;
  const_iterator cVar2;
  long lVar3;
  cmdline_error *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,name);
  if (sVar1 == 0) {
    pcVar4 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&bStack_58,"there is no flag: --",name);
    cmdline_error::cmdline_error(pcVar4,&bStack_58);
    __cxa_throw(pcVar4,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)this,name);
  if (*(long *)(cVar2._M_node + 2) != 0) {
    lVar3 = __dynamic_cast(*(long *)(cVar2._M_node + 2),&option_base::typeinfo,
                           &option_with_value<std::__cxx11::string>::typeinfo,0);
    if (lVar3 != 0) {
      return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar3 + 0x78);
    }
  }
  pcVar4 = (cmdline_error *)__cxa_allocate_exception(0x28);
  std::operator+(&local_38,"type mismatch flag \'",name);
  std::operator+(&bStack_58,&local_38,"\'");
  cmdline_error::cmdline_error(pcVar4,&bStack_58);
  __cxa_throw(pcVar4,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
}

Assistant:

const T &get(const std::string &name) const {
    if (options.count(name) == 0)
      throw cmdline_error("there is no flag: --" + name);
    const option_with_value<T> *p =
        dynamic_cast<const option_with_value<T> *>(options.find(name)->second);
    if (p == NULL)
      throw cmdline_error("type mismatch flag '" + name + "'");
    return p->get();
  }